

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.h
# Opt level: O0

void __thiscall FIX::ThreadedSocketInitiator::lock(ThreadedSocketInitiator *this)

{
  Locker local_18;
  Locker l;
  ThreadedSocketInitiator *this_local;
  
  l.m_mutex = (Mutex *)this;
  Locker::Locker(&local_18,&this->m_mutex);
  Locker::~Locker(&local_18);
  return;
}

Assistant:

void lock() { Locker l(m_mutex); }